

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc-parse.c
# Opt level: O2

void ZCCParse(void *yyp,int yymajor,ZCCToken yyminor,ZCCParseState *stat)

{
  ushort uVar1;
  short sVar2;
  undefined8 uVar3;
  bool bVar4;
  FILE *__stream;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  FString *pFVar8;
  uint yyMajor;
  char *tail;
  ushort *puVar9;
  long lVar10;
  byte bVar11;
  int j;
  ulong uVar12;
  ulong uVar13;
  byte *pbVar14;
  ZCCToken yyMinor;
  ZCCToken yyMinor_00;
  FString expecting;
  long *local_60;
  FString unexpected;
  FString local_50;
  anon_union_8_3_77c0fe9c_for_ZCCToken_0 local_48;
  long local_40;
  char *local_38;
  
  local_48 = yyminor.field_0;
  uVar13 = (ulong)(uint)yymajor;
  if (*yyp < 0) {
    *(undefined8 *)yyp = 0xffffffff00000000;
    *(undefined2 *)((long)yyp + 0x10) = 0;
    *(undefined1 *)((long)yyp + 0x12) = 0;
    if (yyTraceFILE == (FILE *)0x0) {
      *(ZCCParseState **)((long)yyp + 8) = stat;
      goto LAB_00605162;
    }
    fprintf((FILE *)yyTraceFILE,"%sInitialize. Empty stack. State 0\n",yyTracePrompt);
  }
  __stream = yyTraceFILE;
  *(ZCCParseState **)((long)yyp + 8) = stat;
  if (__stream != (FILE *)0x0) {
    fprintf((FILE *)__stream,"%sInput \'%s\'\n",yyTracePrompt,yyTokenName[yymajor]);
  }
LAB_00605162:
  local_60 = (long *)((long)yyp + 8);
  iVar5 = *yyp;
  local_38 = FString::NullString.Nothing;
  bVar4 = false;
  do {
    uVar1 = *(ushort *)((long)yyp + (long)iVar5 * 0x30 + 0x10);
    yyMajor = (uint)uVar13;
    if (uVar1 < 0x2cd) {
      if (0xf4 < uVar1) {
        __assert_fail("stateno <= YY_SHIFT_COUNT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/build_O2/src/zcc-parse.c"
                      ,0x65f,"unsigned int yy_find_shift_action(yyParser *, unsigned char)");
      }
      sVar2 = yy_shift_ofst[uVar1];
      puVar9 = yy_default + uVar1;
      uVar12 = uVar13;
      if (sVar2 != -0x31) {
        while( true ) {
          bVar11 = (byte)uVar12;
          if (bVar11 == 0xda) {
            __assert_fail("iLookAhead!=YYNOCODE",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/build_O2/src/zcc-parse.c"
                          ,0x663,"unsigned int yy_find_shift_action(yyParser *, unsigned char)");
          }
          uVar7 = uVar12 & 0xff;
          uVar6 = (int)uVar7 + (int)sVar2;
          if ((uVar6 < 0x880) && (yy_lookahead[uVar6] == bVar11)) break;
          if (((bVar11 == 0) || (0x5d < bVar11)) || (uVar12 = (ulong)""[uVar7], uVar12 == 0))
          goto LAB_006051be;
          if (yyTraceFILE != (FILE *)0x0) {
            fprintf((FILE *)yyTraceFILE,"%sFALLBACK %s => %s\n",yyTracePrompt,yyTokenName[uVar7],
                    yyTokenName[uVar12]);
          }
          if (""[uVar12] != '\0') {
            __assert_fail("yyFallback[iFallback]==0",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/build_O2/src/zcc-parse.c"
                          ,0x671,"unsigned int yy_find_shift_action(yyParser *, unsigned char)");
          }
        }
        puVar9 = yy_action + uVar6;
      }
LAB_006051be:
      uVar1 = *puVar9;
      if (uVar1 < 0x2cd) {
        uVar6 = uVar1 + 0x113;
        if (uVar1 < 0xf5) {
          uVar6 = (uint)uVar1;
        }
        yyMinor_00.SourceLoc = yyminor.SourceLoc;
        yyMinor_00.field_0.Float = local_48.Float;
        yyMinor_00._12_4_ = 0;
        yy_shift((yyParser_conflict *)yyp,uVar6,yyMajor,yyMinor_00);
        *(int *)((long)yyp + 4) = *(int *)((long)yyp + 4) + -1;
LAB_0060555d:
        if (yyTraceFILE != (FILE *)0x0) {
          fprintf((FILE *)yyTraceFILE,"%sReturn. Stack=",yyTracePrompt);
          pbVar14 = (byte *)((long)yyp + 0x42);
          for (lVar10 = 1; lVar10 <= *yyp; lVar10 = lVar10 + 1) {
            uVar3 = 0x20;
            if (lVar10 == 1) {
              uVar3 = 0x5b;
            }
            fprintf((FILE *)yyTraceFILE,"%c%s",uVar3,yyTokenName[*pbVar14]);
            pbVar14 = pbVar14 + 0x30;
          }
          fwrite("]\n",2,1,(FILE *)yyTraceFILE);
        }
        return;
      }
    }
    if (uVar1 < 0x3e0) {
      yy_reduce((yyParser_conflict *)yyp,uVar1 - 0x2cd);
    }
    else {
      if (uVar1 != 0x3e0) {
        __assert_fail("yyact == YY_ERROR_ACTION",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/build_O2/src/zcc-parse.c"
                      ,0x1165,"void ZCCParse(void *, int, ZCCToken, ZCCParseState *)");
      }
      if (yyTraceFILE != (FILE *)0x0) {
        fprintf((FILE *)yyTraceFILE,"%sSyntax Error!\n",yyTracePrompt);
      }
      uVar6 = *yyp;
      if (*(int *)((long)yyp + 4) < 0) {
        lVar10 = *local_60;
        FString::NullString.RefCount = FString::NullString.RefCount + 2;
        unexpected.Chars = local_38;
        expecting.Chars = local_38;
        uVar1 = *(ushort *)((long)yyp + (long)(int)uVar6 * 0x30 + 0x10);
        pFVar8 = FString::operator+=(&unexpected,"Unexpected ");
        local_40 = lVar10;
        ZCCTokenName((int)&local_50);
        FString::operator+=(pFVar8,&local_50);
        FString::~FString(&local_50);
        lVar10 = local_40;
        if ((uVar1 < 0x6d8) && (sVar2 = yy_shift_ofst[uVar1], (long)sVar2 != -0x31)) {
          for (uVar13 = 1; uVar13 != 0x80; uVar13 = uVar13 + 1) {
            uVar12 = (long)sVar2 + uVar13;
            if ((uVar12 < 0x880) && (uVar13 == yy_lookahead[uVar12])) {
              tail = "Expecting ";
              if (*(int *)(expecting.Chars + -0xc) != 0) {
                tail = " or ";
              }
              pFVar8 = FString::operator+=(&expecting,tail);
              ZCCTokenName((int)&local_50);
              FString::operator+=(pFVar8,&local_50);
              FString::~FString(&local_50);
              lVar10 = local_40;
            }
          }
        }
        FScanner::ScriptMessage
                  (*(FScanner **)(lVar10 + 0x828),"%s\n%s\n",unexpected.Chars,expecting.Chars);
        *(long *)((long)yyp + 8) = lVar10;
        FString::~FString(&expecting);
        FString::~FString(&unexpected);
        uVar6 = *yyp;
      }
      if (bVar4) {
        uVar6 = 0xda;
        if (yyTraceFILE != (FILE *)0x0) {
          fprintf((FILE *)yyTraceFILE,"%sDiscard input token %s\n",yyTracePrompt,
                  yyTokenName[(int)yyMajor]);
        }
      }
      else {
        while (-1 < (int)uVar6) {
          uVar6 = yy_find_reduce_action
                            ((uint)*(ushort *)((long)yyp + (ulong)uVar6 * 0x30 + 0x10),0x80);
          if (uVar6 < 0x2cd) {
            if ((yyMajor != 0) && (-1 < *yyp)) {
              yyMinor.SourceLoc = yyminor.SourceLoc;
              yyMinor.field_0.Float = local_48.Float;
              yyMinor._12_4_ = 0;
              yy_shift((yyParser_conflict *)yyp,uVar6,0x80,yyMinor);
              uVar6 = yyMajor;
              goto LAB_0060547b;
            }
            break;
          }
          yy_pop_parser_stack((yyParser_conflict *)yyp);
          uVar6 = *yyp;
        }
        lVar10 = *local_60;
        if (yyTraceFILE != (FILE *)0x0) {
          fprintf((FILE *)yyTraceFILE,"%sFail!\n",yyTracePrompt);
        }
        while (-1 < *yyp) {
          yy_pop_parser_stack((yyParser_conflict *)yyp);
        }
        *local_60 = lVar10;
        uVar6 = 0xda;
      }
LAB_0060547b:
      *(undefined4 *)((long)yyp + 4) = 3;
      bVar4 = true;
      uVar13 = (ulong)uVar6;
    }
    if (((int)uVar13 == 0xda) || (iVar5 = *yyp, iVar5 < 0)) goto LAB_0060555d;
  } while( true );
}

Assistant:

void ZCCParse(
  void *yyp,                   /* The parser */
  int yymajor,                 /* The major token code number */
  ZCCParseTOKENTYPE yyminor       /* The value for the token */
  ZCCParseARG_PDECL               /* Optional %extra_argument parameter */
){
  YYMINORTYPE yyminorunion;
  unsigned int yyact;   /* The parser action. */
#if !defined(YYERRORSYMBOL) && !defined(YYNOERRORRECOVERY)
  int yyendofinput;     /* True if we are at the end of input */
#endif
#ifdef YYERRORSYMBOL
  int yyerrorhit = 0;   /* True if yymajor has invoked an error */
#endif
  yyParser *yypParser;  /* The parser */

  /* (re)initialize the parser, if necessary */
  yypParser = (yyParser*)yyp;
  if( yypParser->yyidx<0 ){
#if YYSTACKDEPTH<=0
    if( yypParser->yystksz <=0 ){
      yyStackOverflow(yypParser);
      return;
    }
#endif
    yypParser->yyidx = 0;
#ifndef YYNOERRORRECOVERY
    yypParser->yyerrcnt = -1;
#endif
    yypParser->yystack[0].stateno = 0;
    yypParser->yystack[0].major = 0;
#ifndef NDEBUG
    if( yyTraceFILE ){
      fprintf(yyTraceFILE,"%sInitialize. Empty stack. State 0\n",
              yyTracePrompt);
    }
#endif
  }
#if !defined(YYERRORSYMBOL) && !defined(YYNOERRORRECOVERY)
  yyendofinput = (yymajor==0);
#endif
  ZCCParseARG_STORE;

#ifndef NDEBUG
  if( yyTraceFILE ){
    fprintf(yyTraceFILE,"%sInput '%s'\n",yyTracePrompt,yyTokenName[yymajor]);
  }
#endif

  do{
    yyact = yy_find_shift_action(yypParser,(YYCODETYPE)yymajor);
    if( yyact <= YY_MAX_SHIFTREDUCE ){
      if( yyact > YY_MAX_SHIFT ) yyact += YY_MIN_REDUCE - YY_MIN_SHIFTREDUCE;
      yy_shift(yypParser,yyact,yymajor,yyminor);
#ifndef YYNOERRORRECOVERY
      yypParser->yyerrcnt--;
#endif
      yymajor = YYNOCODE;
    }else if( yyact <= YY_MAX_REDUCE ){
      yy_reduce(yypParser,yyact-YY_MIN_REDUCE);
    }else{
#ifdef YYERRORSYMBOL
      int yymx;
#endif
      assert( yyact == YY_ERROR_ACTION );
      yyminorunion.yy0 = yyminor;
#ifndef NDEBUG
      if( yyTraceFILE ){
        fprintf(yyTraceFILE,"%sSyntax Error!\n",yyTracePrompt);
      }
#endif
#ifdef YYERRORSYMBOL
      /* A syntax error has occurred.
      ** The response to an error depends upon whether or not the
      ** grammar defines an error token "ERROR".
      **
      ** This is what we do if the grammar does define ERROR:
      **
      **  * Call the %syntax_error function.
      **
      **  * Begin popping the stack until we enter a state where
      **    it is legal to shift the error symbol, then shift
      **    the error symbol.
      **
      **  * Set the error count to three.
      **
      **  * Begin accepting and shifting new tokens.  No new error
      **    processing will occur until three tokens have been
      **    shifted successfully.
      **
      */
      if( yypParser->yyerrcnt<0 ){
        yy_syntax_error(yypParser,yymajor,yyminor);
      }
      yymx = yypParser->yystack[yypParser->yyidx].major;
      if( yymx==YYERRORSYMBOL || yyerrorhit ){
#ifndef NDEBUG
        if( yyTraceFILE ){
          fprintf(yyTraceFILE,"%sDiscard input token %s\n",
             yyTracePrompt,yyTokenName[yymajor]);
        }
#endif
        yy_destructor(yypParser, (YYCODETYPE)yymajor, &yyminorunion);
        yymajor = YYNOCODE;
      }else{
        while(
          yypParser->yyidx >= 0 &&
          yymx != YYERRORSYMBOL &&
          (yyact = yy_find_reduce_action(
                        yypParser->yystack[yypParser->yyidx].stateno,
                        YYERRORSYMBOL)) >= YY_MIN_REDUCE
        ){
          yy_pop_parser_stack(yypParser);
        }
        if( yypParser->yyidx < 0 || yymajor==0 ){
          yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
          yy_parse_failed(yypParser);
          yymajor = YYNOCODE;
        }else if( yymx!=YYERRORSYMBOL ){
          yy_shift(yypParser,yyact,YYERRORSYMBOL,yyminor);
        }
      }
      yypParser->yyerrcnt = 3;
      yyerrorhit = 1;
#elif defined(YYNOERRORRECOVERY)
      /* If the YYNOERRORRECOVERY macro is defined, then do not attempt to
      ** do any kind of error recovery.  Instead, simply invoke the syntax
      ** error routine and continue going as if nothing had happened.
      **
      ** Applications can set this macro (for example inside %include) if
      ** they intend to abandon the parse upon the first syntax error seen.
      */
      yy_syntax_error(yypParser,yymajor, yyminor);
      yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
      yymajor = YYNOCODE;

#else  /* YYERRORSYMBOL is not defined */
      /* This is what we do if the grammar does not define ERROR:
      **
      **  * Report an error message, and throw away the input token.
      **
      **  * If the input token is $, then fail the parse.
      **
      ** As before, subsequent error messages are suppressed until
      ** three input tokens have been successfully shifted.
      */
      if( yypParser->yyerrcnt<=0 ){
        yy_syntax_error(yypParser,yymajor, yyminor);
      }
      yypParser->yyerrcnt = 3;
      yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
      if( yyendofinput ){
        yy_parse_failed(yypParser);
      }
      yymajor = YYNOCODE;
#endif
    }
  }while( yymajor!=YYNOCODE && yypParser->yyidx>=0 );
#ifndef NDEBUG
  if( yyTraceFILE ){
    int i;
    fprintf(yyTraceFILE,"%sReturn. Stack=",yyTracePrompt);
    for(i=1; i<=yypParser->yyidx; i++)
      fprintf(yyTraceFILE,"%c%s", i==1 ? '[' : ' ', 
              yyTokenName[yypParser->yystack[i].major]);
    fprintf(yyTraceFILE,"]\n");
  }
#endif
  return;
}